

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::OpenBuildFileStream(cmGlobalNinjaGenerator *this)

{
  Encoding encoding;
  string *psVar1;
  cmGeneratedFileStream *this_00;
  ostream *poVar2;
  string buildFilePath;
  string local_30;
  
  psVar1 = cmake::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  std::__cxx11::string::string((string *)&local_30,(string *)psVar1);
  std::__cxx11::string::append((char *)&local_30);
  std::__cxx11::string::append((char *)&local_30);
  this_00 = this->BuildFileStream;
  if (this_00 == (cmGeneratedFileStream *)0x0) {
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    encoding = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                 _vptr_cmGlobalGenerator[5])(this);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,&local_30,false,encoding);
    this->BuildFileStream = this_00;
  }
  WriteDisclaimer(this,(ostream *)this_00);
  poVar2 = std::operator<<((ostream *)this->BuildFileStream,
                           "# This file contains all the build statements describing the\n");
  std::operator<<(poVar2,"# compilation DAG.\n\n");
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::OpenBuildFileStream()
{
  // Compute Ninja's build file path.
  std::string buildFilePath =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  buildFilePath += "/";
  buildFilePath += cmGlobalNinjaGenerator::NINJA_BUILD_FILE;

  // Get a stream where to generate things.
  if (!this->BuildFileStream) {
    this->BuildFileStream = new cmGeneratedFileStream(
      buildFilePath, false, this->GetMakefileEncoding());
    if (!this->BuildFileStream) {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return;
    }
  }

  // Write the do not edit header.
  this->WriteDisclaimer(*this->BuildFileStream);

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n";
}